

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall QLayout::isEmpty(QLayout *this)

{
  QLayout *in_stack_00000018;
  
  isEmpty(in_stack_00000018);
  return;
}

Assistant:

bool QLayout::isEmpty() const
{
    int i = 0;
    QLayoutItem *item = itemAt(i);
    while (item) {
        if (!item->isEmpty())
            return false;
        ++i;
        item = itemAt(i);
    }
    return true;
}